

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CheckVisibilityRules
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  Descriptor *pDVar1;
  EnumDescriptor *pEVar2;
  ServiceDescriptor *pSVar3;
  DescriptorPool *pDVar4;
  _Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
  _Var5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  DescriptorBuilder *pDVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar7;
  DescriptorAndProto *nested;
  DescriptorBuilder *pDVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  string_view element_name;
  string_view element_name_00;
  VisibilityCheckerState state;
  DescriptorBuilder *local_b8;
  undefined1 *local_b0;
  DescriptorBuilder *local_a8;
  VoidPtr local_a0;
  code *pcStack_98;
  VoidPtr local_90;
  code *pcStack_88;
  undefined1 local_80 [8];
  DescriptorBuilder *local_78;
  DescriptorBuilder *pDStack_70;
  long local_68;
  DescriptorBuilder *pDStack_60;
  DescriptorBuilder *local_58;
  long lStack_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_b0 = local_80;
  local_48 = (void *)0x0;
  uStack_40 = 0;
  local_58 = (DescriptorBuilder *)0x0;
  lStack_50 = 0;
  local_68 = 0;
  pDStack_60 = (DescriptorBuilder *)0x0;
  local_78 = (DescriptorBuilder *)0x0;
  pDStack_70 = (DescriptorBuilder *)0x0;
  local_38 = 0;
  local_b8 = this;
  local_a8 = this;
  if (0 < file->message_type_count_) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      pDVar1 = file->message_types_;
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                            (int)lVar10);
      internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::$_2>>
      ::Visit<google::protobuf::DescriptorProto_const>
                ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__2>>
                  *)&local_b8,(Descriptor *)(&pDVar1->super_SymbolBase + lVar11),proto_00);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xa0;
    } while (lVar10 < file->message_type_count_);
  }
  if (0 < file->enum_type_count_) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      pEVar2 = file->enum_types_;
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            (int)lVar10);
      internal::
      VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::$_2>>
      ::Visit<google::protobuf::EnumDescriptorProto_const>
                ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__2>>
                  *)&local_b8,(EnumDescriptor *)(&pEVar2->super_SymbolBase + lVar11),proto_01);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x58;
    } while (lVar10 < file->enum_type_count_);
  }
  if (0 < file->extension_count_) {
    iVar9 = 0;
    do {
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar9);
      iVar9 = iVar9 + 1;
    } while (iVar9 < file->extension_count_);
  }
  if (0 < file->service_count_) {
    lVar10 = 0;
    do {
      pSVar3 = file->services_;
      pVVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                         (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,(int)lVar10);
      if (0 < pSVar3[lVar10].method_count_) {
        iVar9 = 0;
        do {
          internal::RepeatedPtrFieldBase::
          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                    (&(pVVar7->field_0)._impl_.method_.super_RepeatedPtrFieldBase,iVar9);
          iVar9 = iVar9 + 1;
        } while (iVar9 < pSVar3[lVar10].method_count_);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < file->service_count_);
  }
  pDVar6 = pDStack_70;
  if (local_78 != pDStack_70) {
    pDVar8 = local_78;
    do {
      pDVar4 = pDVar8->pool_;
      if ((((pDVar4->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i & 0x30000) ==
           0x20000) &&
         (*(int *)((long)&((pDVar4->tables_)._M_t.
                           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                          ._M_head_impl)->known_bad_symbols_ + 0x14) == 4)) {
        element_name._M_len =
             (ulong)*(ushort *)((long)&(pDVar4->mutex_->mu_).super___atomic_base<long>._M_i + 2);
        element_name._M_str =
             (char *)((long)&(pDVar4->mutex_->mu_).super___atomic_base<long>._M_i +
                     ~element_name._M_len);
        pcStack_88 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.ptr_.obj = &local_b8;
        local_b8 = pDVar8;
        local_90.obj = &local_b8;
        AddError(local_a8,element_name,(Message *)pDVar8->tables_,INPUT_TYPE,make_error);
      }
      pDVar8 = (DescriptorBuilder *)&pDVar8->deferred_validation_;
    } while (pDVar8 != pDVar6);
  }
  pDVar6 = local_58;
  if (pDStack_60 != local_58) {
    pDVar8 = pDStack_60;
    do {
      pDVar4 = pDVar8->pool_;
      if ((((pDVar4->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i & 0xc00) == 0x800)
         && (*(int *)((pDVar4->dispatcher_)._M_t.
                      super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
                      .
                      super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
                      ._M_head_impl + 0x4c) == 4)) {
        _Var5._M_head_impl =
             (pDVar4->field_memo_table_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
             ._M_head_impl;
        element_name_00._M_len =
             (ulong)*(ushort *)
                     ((long)&(_Var5._M_head_impl)->
                             super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                     + 2);
        element_name_00._M_str =
             (char *)((long)&(_Var5._M_head_impl)->
                             super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                     + ~element_name_00._M_len);
        pcStack_98 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__1,std::__cxx11::string>
        ;
        make_error_00.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::CheckVisibilityRules(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__1,std::__cxx11::string>
        ;
        make_error_00.ptr_.obj = &local_b8;
        local_b8 = pDVar8;
        local_a0.obj = &local_b8;
        AddError(local_a8,element_name_00,(Message *)pDVar8->tables_,INPUT_TYPE,make_error_00);
      }
      pDVar8 = (DescriptorBuilder *)&pDVar8->deferred_validation_;
    } while (pDVar8 != pDVar6);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  if (pDStack_60 != (DescriptorBuilder *)0x0) {
    operator_delete(pDStack_60,lStack_50 - (long)pDStack_60);
  }
  if (local_78 != (DescriptorBuilder *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckVisibilityRules(FileDescriptor* file,
                                             const FileDescriptorProto& proto) {
  // Check DefaultSymbolVisibility first.
  //
  // For Edition 2024:
  // If DefaultSymbolVisibility is STRICT enforce it with caveats for:
  //

  VisibilityCheckerState state;

  // Build our state object so we can apply rules based on type.
  internal::VisitDescriptors(
      *file, proto,
      [&](const auto& descriptor, const auto& proto)
          -> decltype(CheckVisibilityRulesVisit(descriptor, proto, state)) {
        CheckVisibilityRulesVisit(descriptor, proto, state);
      });

  // In edition 2024 we only enforce STRICT visibilty rules. There are possibly
  // more rules to come in future editions, but for now just apply the rule for
  // enforcing nested symbol local visibilty. There is a single caveat for,
  // allowing nested enums to have visibility set only when
  //
  // local msg { export enum {} reserved 1 to max; }
  for (auto& nested : state.nested_messages) {
    if (nested.descriptor->visibility_keyword() ==
            SymbolVisibility::VISIBILITY_EXPORT &&
        nested.descriptor->features().default_symbol_visibility() ==
            FeatureSet::VisibilityFeature::STRICT) {
      AddError(
          nested.descriptor->full_name(), *nested.proto,
          DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
            return absl::StrCat(
                "\"", nested.descriptor->name(),
                "\" is a nested message and cannot be `export` with STRICT "
                "default_symbol_visibility. It must be moved to top-level, "
                "ideally "
                "in its own file in order to be `export`.");
          });
    }
  }

  for (auto& nested : state.nested_enums) {
    if (nested.descriptor->visibility_keyword() ==
            SymbolVisibility::VISIBILITY_EXPORT &&
        nested.descriptor->features().default_symbol_visibility() ==
            FeatureSet::VisibilityFeature::STRICT) {
      // This list contains only enums not considered 'namespaced' by
      // IsEnumNamespaceMessage

      AddError(nested.descriptor->full_name(), *nested.proto,
               DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
                 return absl::StrCat(
                     "\"", nested.descriptor->name(),
                     "\" is a nested enum and cannot be marked `export` with "
                     "STRICT "
                     "default_symbol_visibility. It must be moved to "
                     "top-level, ideally "
                     "in its own file in order to be `export`. For C++ "
                     "namespacing of enums in a messages use: `local "
                     "message <OuterNamespace> { export enum ",
                     nested.descriptor->name(), " {...} reserved 1 to max; }`");
               });
    }

    // Enforce Future rules here:
  }
}